

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void StoreCompressedMetaBlockHeader
               (int is_final_block,size_t length,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  size_t nlenbits;
  uint64_t lenbits;
  uint64_t nibblesbits;
  size_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  uVar2 = *storage_ix;
  *(ulong *)(storage + (uVar2 >> 3)) =
       (long)is_final_block << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  uVar1 = uVar2 + 1;
  *storage_ix = uVar1;
  if (is_final_block == 0) {
    BrotliEncodeMlen(length,&local_40,&local_48,&local_38);
    *(uint64_t *)(storage + (uVar1 >> 3)) =
         local_38 << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
    uVar1 = uVar2 + 3;
    *storage_ix = uVar1;
    *(uint64_t *)(storage + (uVar1 >> 3)) =
         local_40 << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
    uVar1 = local_48 + uVar2 + 3;
    *storage_ix = uVar1;
    uVar1 = uVar1 >> 3;
    *(ulong *)(storage + uVar1) = (ulong)storage[uVar1];
    local_48 = uVar2 + local_48 + 4;
  }
  else {
    *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3];
    uVar1 = uVar2 + 2;
    *storage_ix = uVar1;
    BrotliEncodeMlen(length,&local_40,&local_48,&local_38);
    *(uint64_t *)(storage + (uVar1 >> 3)) =
         local_38 << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
    uVar2 = uVar2 + 4;
    *storage_ix = uVar2;
    local_48 = uVar2 + local_48;
    *(uint64_t *)(storage + (uVar2 >> 3)) =
         local_40 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  }
  *storage_ix = local_48;
  return;
}

Assistant:

static void StoreCompressedMetaBlockHeader(BROTLI_BOOL is_final_block,
                                           size_t length,
                                           size_t* storage_ix,
                                           uint8_t* storage) {
  uint64_t lenbits;
  size_t nlenbits;
  uint64_t nibblesbits;

  /* Write ISLAST bit. */
  BrotliWriteBits(1, (uint64_t)is_final_block, storage_ix, storage);
  /* Write ISEMPTY bit. */
  if (is_final_block) {
    BrotliWriteBits(1, 0, storage_ix, storage);
  }

  BrotliEncodeMlen(length, &lenbits, &nlenbits, &nibblesbits);
  BrotliWriteBits(2, nibblesbits, storage_ix, storage);
  BrotliWriteBits(nlenbits, lenbits, storage_ix, storage);

  if (!is_final_block) {
    /* Write ISUNCOMPRESSED bit. */
    BrotliWriteBits(1, 0, storage_ix, storage);
  }
}